

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall gnilk::LogConsoleSink::~LogConsoleSink(LogConsoleSink *this)

{
  LogBaseSink::~LogBaseSink(&this->super_LogBaseSink);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~LogConsoleSink() = default;